

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# laswriteitemcompressed_v4.cpp
# Opt level: O3

void __thiscall
LASwriteItemCompressed_BYTE14_v4::~LASwriteItemCompressed_BYTE14_v4
          (LASwriteItemCompressed_BYTE14_v4 *this)

{
  U8 *pUVar1;
  ArithmeticEncoder *this_00;
  uint uVar2;
  ArithmeticModel **ppAVar3;
  ByteStreamOutArray **ppBVar4;
  ulong uVar5;
  long lVar6;
  
  (this->super_LASwriteItemCompressed).super_LASwriteItem._vptr_LASwriteItem =
       (_func_int **)&PTR_write_0015d748;
  lVar6 = 0;
  do {
    ppAVar3 = this->contexts[lVar6].m_bytes;
    if (ppAVar3 != (ArithmeticModel **)0x0) {
      if (this->number == 0) {
LAB_0013ae05:
        operator_delete__(ppAVar3);
      }
      else {
        uVar5 = 0;
        do {
          ArithmeticEncoder::destroySymbolModel
                    (this->enc_Bytes[uVar5],this->contexts[lVar6].m_bytes[uVar5]);
          uVar5 = uVar5 + 1;
        } while (uVar5 < this->number);
        ppAVar3 = this->contexts[lVar6].m_bytes;
        if (ppAVar3 != (ArithmeticModel **)0x0) goto LAB_0013ae05;
      }
      pUVar1 = this->contexts[lVar6].last_item;
      if (pUVar1 != (U8 *)0x0) {
        operator_delete__(pUVar1);
      }
    }
    lVar6 = lVar6 + 1;
  } while (lVar6 != 4);
  ppBVar4 = this->outstream_Bytes;
  if (ppBVar4 == (ByteStreamOutArray **)0x0) goto LAB_0013ae94;
  uVar2 = this->number;
  if (uVar2 == 0) {
LAB_0013ae81:
    operator_delete__(ppBVar4);
  }
  else {
    uVar5 = 0;
    do {
      if (this->outstream_Bytes[uVar5] != (ByteStreamOutArray *)0x0) {
        (*(this->outstream_Bytes[uVar5]->super_ByteStreamOut)._vptr_ByteStreamOut[0xd])();
        this_00 = this->enc_Bytes[uVar5];
        if (this_00 != (ArithmeticEncoder *)0x0) {
          ArithmeticEncoder::~ArithmeticEncoder(this_00);
        }
        operator_delete(this_00);
        uVar2 = this->number;
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 < uVar2);
    ppBVar4 = this->outstream_Bytes;
    if (ppBVar4 != (ByteStreamOutArray **)0x0) goto LAB_0013ae81;
  }
  if (this->enc_Bytes != (ArithmeticEncoder **)0x0) {
    operator_delete__(this->enc_Bytes);
  }
LAB_0013ae94:
  if (this->num_bytes_Bytes != (U32 *)0x0) {
    operator_delete__(this->num_bytes_Bytes);
  }
  if (this->changed_Bytes != (BOOL *)0x0) {
    operator_delete__(this->changed_Bytes);
    return;
  }
  return;
}

Assistant:

LASwriteItemCompressed_BYTE14_v4::~LASwriteItemCompressed_BYTE14_v4()
{
  /* destroy all initialized scanner channel contexts */

  U32 c, i;
  for (c = 0; c < 4; c++)
  {
    if (contexts[c].m_bytes)
    {
      for (i = 0; i < number; i++)
      {
        enc_Bytes[i]->destroySymbolModel(contexts[c].m_bytes[i]);
      }
      delete [] contexts[c].m_bytes;
      delete [] contexts[c].last_item;
    }
  }

  /* destroy all outstream and encoder arrays */

  if (outstream_Bytes)
  {
    for (i = 0; i < number; i++)
    {
      if (outstream_Bytes[i])
      {
        delete outstream_Bytes[i];
        delete enc_Bytes[i];
      }
    }

    delete [] outstream_Bytes;
    delete [] enc_Bytes;
  }

  /* destroy all other arrays */

  if (num_bytes_Bytes) delete [] num_bytes_Bytes;

  if (changed_Bytes) delete [] changed_Bytes;
}